

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

NTRUEncodeSchedule * ntru_encode_pubkey_schedule(uint p,uint q)

{
  uint16_t *ms_in;
  ulong uVar1;
  NTRUEncodeSchedule *pNVar2;
  ulong factor1;
  
  factor1 = (ulong)p;
  ms_in = (uint16_t *)safemalloc(factor1,2,0);
  if (p != 0) {
    uVar1 = 0;
    do {
      ms_in[uVar1] = (uint16_t)q;
      uVar1 = uVar1 + 1;
    } while (factor1 != uVar1);
  }
  pNVar2 = ntru_encode_schedule(ms_in,factor1);
  safefree(ms_in);
  return pNVar2;
}

Assistant:

static NTRUEncodeSchedule *ntru_encode_pubkey_schedule(unsigned p, unsigned q)
{
    uint16_t *ms = snewn(p, uint16_t);
    for (size_t i = 0; i < p; i++)
        ms[i] = q;
    NTRUEncodeSchedule *sched = ntru_encode_schedule(ms, p);
    sfree(ms);
    return sched;
}